

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::TagModuleField::~TagModuleField(TagModuleField *this)

{
  ~TagModuleField(this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

explicit TagModuleField(const Location& loc = Location(),
                          std::string_view name = std::string_view())
      : ModuleFieldMixin<ModuleFieldType::Tag>(loc), tag(name) {}